

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

void moira::sprintd_signed(char **s,i64 value)

{
  char *pcVar1;
  int digits;
  u64 local_18;
  i64 value_local;
  char **s_local;
  
  local_18 = value;
  if (value < 0) {
    pcVar1 = *s;
    *s = pcVar1 + 1;
    *pcVar1 = '-';
    local_18 = -value;
  }
  digits = decDigits(local_18);
  sprintd(s,local_18,digits);
  return;
}

Assistant:

static void sprintd_signed(char *&s, i64 value)
{
    if (value < 0) { *s++ = '-'; value *= -1; }
    sprintd(s, value, decDigits(value));
}